

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O0

ZyanBool ZydisCheckConstraints(ZydisEncoderInstructionMatch *match)

{
  byte bVar1;
  ZydisRegister ZVar2;
  ZydisRegister ZVar3;
  ZydisRegister ZVar4;
  ZydisEncoderRequest *pZVar5;
  ZydisInstructionDefinition *pZVar6;
  ZyanI8 ZVar7;
  ZyanI8 ZVar8;
  ZyanI8 ZVar9;
  ushort uVar10;
  ZydisEncoderOperand *pZVar11;
  ZydisRegister local_6c;
  ZyanI8 index_1;
  ZyanI8 dest_3;
  ZydisInstructionDefinitionMVEX *mvex_def;
  ZydisRegister source2_1;
  ZydisRegister source1_1;
  ZydisRegister dest_2;
  ZydisInstructionDefinitionEVEX *evex_def;
  ZydisRegister source2;
  ZydisRegister source1;
  ZydisRegister dest_1;
  ZyanI8 mask;
  ZyanI8 index;
  ZyanI8 dest;
  ZydisInstructionDefinitionVEX *vex_def;
  ZyanBool is_gather;
  ZydisEncoderOperand *operands;
  ZydisEncoderInstructionMatch *match_local;
  
  pZVar5 = match->request;
  pZVar11 = pZVar5->operands;
  uVar10 = *(ushort *)&match->definition->field_0x6 & 7;
  if (uVar10 == 3) {
    pZVar6 = match->base_definition;
    if ((*(byte *)(pZVar6 + 1) >> 3 & 1) != 0) {
      if (match->request->operand_count != '\x03') {
        __assert_fail("match->request->operand_count == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa11,"ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)")
        ;
      }
      if (pZVar11->type != ZYDIS_OPERAND_TYPE_REGISTER) {
        __assert_fail("operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa12,"ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)")
        ;
      }
      if (pZVar5->operands[1].type != ZYDIS_OPERAND_TYPE_MEMORY) {
        __assert_fail("operands[1].type == ZYDIS_OPERAND_TYPE_MEMORY",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa13,"ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)")
        ;
      }
      if (pZVar5->operands[2].type != ZYDIS_OPERAND_TYPE_REGISTER) {
        __assert_fail("operands[2].type == ZYDIS_OPERAND_TYPE_REGISTER",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa14,"ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)")
        ;
      }
      ZVar8 = ZydisRegisterGetId(pZVar5->operands[0].reg.value);
      ZVar9 = ZydisRegisterGetId(pZVar5->operands[1].mem.index);
      ZVar7 = ZydisRegisterGetId(pZVar5->operands[2].reg.value);
      if (((ZVar8 == ZVar9) || (ZVar8 == ZVar7)) || (ZVar9 == ZVar7)) {
        return '\0';
      }
    }
    if ((*(byte *)(pZVar6 + 1) >> 5 & 1) != 0) {
      if (match->request->operand_count != '\x03') {
        __assert_fail("match->request->operand_count == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa22,"ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)")
        ;
      }
      if (pZVar11->type != ZYDIS_OPERAND_TYPE_REGISTER) {
        __assert_fail("operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa23,"ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)")
        ;
      }
      if (pZVar5->operands[1].type != ZYDIS_OPERAND_TYPE_REGISTER) {
        __assert_fail("operands[1].type == ZYDIS_OPERAND_TYPE_REGISTER",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa24,"ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)")
        ;
      }
      if (pZVar5->operands[2].type != ZYDIS_OPERAND_TYPE_REGISTER) {
        __assert_fail("operands[2].type == ZYDIS_OPERAND_TYPE_REGISTER",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa25,"ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)")
        ;
      }
      ZVar4 = pZVar5->operands[0].reg.value;
      ZVar2 = pZVar5->operands[1].reg.value;
      ZVar3 = pZVar5->operands[2].reg.value;
      if (((ZVar4 == ZVar2) || (ZVar2 == ZVar3)) || (ZVar4 == ZVar3)) {
        return '\0';
      }
    }
  }
  else {
    if (uVar10 == 4) {
      bVar1 = *(byte *)(match->base_definition + 1);
      if ((*(byte *)(match->base_definition + 1) >> 4 & 1) != 0) {
        if (pZVar11->type != ZYDIS_OPERAND_TYPE_REGISTER) {
          __assert_fail("operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0xa39,
                        "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
        }
        if (pZVar5->operands[2].type != ZYDIS_OPERAND_TYPE_REGISTER) {
          __assert_fail("operands[2].type == ZYDIS_OPERAND_TYPE_REGISTER",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0xa3a,
                        "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
        }
        if ((pZVar5->operands[3].type != ZYDIS_OPERAND_TYPE_REGISTER) &&
           (pZVar5->operands[3].type != ZYDIS_OPERAND_TYPE_MEMORY)) {
          __assert_fail("(operands[3].type == ZYDIS_OPERAND_TYPE_REGISTER) || (operands[3].type == ZYDIS_OPERAND_TYPE_MEMORY)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                        ,0xa3c,
                        "ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)");
        }
        ZVar4 = pZVar5->operands[0].reg.value;
        if (pZVar5->operands[3].type == ZYDIS_OPERAND_TYPE_REGISTER) {
          local_6c = pZVar5->operands[3].reg.value;
        }
        else {
          local_6c = ZYDIS_REGISTER_NONE;
        }
        if ((ZVar4 == pZVar5->operands[2].reg.value) || (ZVar4 == local_6c)) {
          return '\0';
        }
      }
    }
    else {
      if (uVar10 != 5) {
        return '\x01';
      }
      bVar1 = *(byte *)(match->base_definition + 1);
    }
    vex_def._7_1_ = bVar1 >> 3 & 1;
    if ((vex_def._7_1_ != 0) && (pZVar11->type == ZYDIS_OPERAND_TYPE_REGISTER)) {
      if (match->request->operand_count != '\x03') {
        __assert_fail("match->request->operand_count == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa57,"ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)")
        ;
      }
      if (pZVar11->type != ZYDIS_OPERAND_TYPE_REGISTER) {
        __assert_fail("operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa58,"ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)")
        ;
      }
      if (pZVar5->operands[2].type != ZYDIS_OPERAND_TYPE_MEMORY) {
        __assert_fail("operands[2].type == ZYDIS_OPERAND_TYPE_MEMORY",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                      ,0xa59,"ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *)")
        ;
      }
      ZVar8 = ZydisRegisterGetId(pZVar5->operands[0].reg.value);
      ZVar9 = ZydisRegisterGetId(pZVar5->operands[2].mem.index);
      if (ZVar8 == ZVar9) {
        return '\0';
      }
    }
  }
  return '\x01';
}

Assistant:

static ZyanBool ZydisCheckConstraints(const ZydisEncoderInstructionMatch *match)
{
    const ZydisEncoderOperand *operands = match->request->operands;
    ZyanBool is_gather = ZYAN_FALSE;
    switch (match->definition->encoding)
    {
    case ZYDIS_INSTRUCTION_ENCODING_VEX:
    {
        const ZydisInstructionDefinitionVEX *vex_def =
            (const ZydisInstructionDefinitionVEX *)match->base_definition;
        if (vex_def->is_gather)
        {
            ZYAN_ASSERT(match->request->operand_count == 3);
            ZYAN_ASSERT(operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER);
            ZYAN_ASSERT(operands[1].type == ZYDIS_OPERAND_TYPE_MEMORY);
            ZYAN_ASSERT(operands[2].type == ZYDIS_OPERAND_TYPE_REGISTER);
            const ZyanI8 dest = ZydisRegisterGetId(operands[0].reg.value);
            const ZyanI8 index = ZydisRegisterGetId(operands[1].mem.index);
            const ZyanI8 mask = ZydisRegisterGetId(operands[2].reg.value);
            // If any pair of the index, mask, or destination registers are the same, the
            // instruction results a UD fault.
            if ((dest == index) || (dest == mask) || (index == mask))
            {
                return ZYAN_FALSE;
            }
        }

        if (vex_def->no_source_source_match)
        {
            ZYAN_ASSERT(match->request->operand_count == 3);
            ZYAN_ASSERT(operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER);
            ZYAN_ASSERT(operands[1].type == ZYDIS_OPERAND_TYPE_REGISTER);
            ZYAN_ASSERT(operands[2].type == ZYDIS_OPERAND_TYPE_REGISTER);
            const ZydisRegister dest = operands[0].reg.value;
            const ZydisRegister source1 = operands[1].reg.value;
            const ZydisRegister source2 = operands[2].reg.value;
            // AMX-E4: #UD if srcdest == src1 OR src1 == src2 OR srcdest == src2.
            if ((dest == source1) || (source1 == source2) || (dest == source2))
            {
                return ZYAN_FALSE;
            }
        }

        return ZYAN_TRUE;
    }
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    {
        const ZydisInstructionDefinitionEVEX *evex_def =
            (const ZydisInstructionDefinitionEVEX *)match->base_definition;
        is_gather = evex_def->is_gather;
        if (evex_def->no_source_dest_match)
        {
            ZYAN_ASSERT(operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER);
            ZYAN_ASSERT(operands[2].type == ZYDIS_OPERAND_TYPE_REGISTER);
            ZYAN_ASSERT((operands[3].type == ZYDIS_OPERAND_TYPE_REGISTER) ||
                        (operands[3].type == ZYDIS_OPERAND_TYPE_MEMORY));
            const ZydisRegister dest = operands[0].reg.value;
            const ZydisRegister source1 = operands[2].reg.value;
            const ZydisRegister source2 = (operands[3].type == ZYDIS_OPERAND_TYPE_REGISTER)
                ? operands[3].reg.value
                : ZYDIS_REGISTER_NONE;

            if ((dest == source1) || (dest == source2))
            {
                return ZYAN_FALSE;
            }
        }
        break;
    }
    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
    {
        const ZydisInstructionDefinitionMVEX *mvex_def =
            (const ZydisInstructionDefinitionMVEX *)match->base_definition;
        is_gather = mvex_def->is_gather;
        break;
    }
    default:
        return ZYAN_TRUE;
    }

    if ((is_gather) && (operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER))
    {
        ZYAN_ASSERT(match->request->operand_count == 3);
        ZYAN_ASSERT(operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER);
        ZYAN_ASSERT(operands[2].type == ZYDIS_OPERAND_TYPE_MEMORY);
        const ZyanI8 dest = ZydisRegisterGetId(operands[0].reg.value);
        const ZyanI8 index = ZydisRegisterGetId(operands[2].mem.index);
        // EVEX: The instruction will #UD fault if the destination vector zmm1 is the same as
        // index vector VINDEX.
        // MVEX: The KNC GATHER instructions forbid using the same vector register for destination
        // and for the index. (https://github.com/intelxed/xed/issues/281#issuecomment-970074554)
        if (dest == index)
        {
            return ZYAN_FALSE;
        }
    }

    return ZYAN_TRUE;
}